

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-tcp-close-while-connecting.c
# Opt level: O3

int run_test_tcp_close_while_connecting(void)

{
  int iVar1;
  int iVar2;
  int extraout_EAX;
  uv_loop_t *loop;
  uv_handle_t *handle;
  int64_t eval_b;
  int64_t eval_b_2;
  sockaddr_in addr;
  uv_connect_t connect_req;
  undefined1 local_98 [32];
  uv_connect_t local_78;
  
  loop = uv_default_loop();
  iVar1 = uv_ip4_addr("1.2.3.4",0x23a3,(sockaddr_in *)(local_98 + 0x10));
  local_78.data = (void *)(long)iVar1;
  local_98._0_8_ = (uv_loop_t *)0x0;
  if ((uv__queue *)local_78.data == (uv__queue *)0x0) {
    iVar1 = uv_tcp_init(loop,&tcp_handle);
    local_78.data = (void *)(long)iVar1;
    local_98._0_8_ = (uv_loop_t *)0x0;
    if ((uv__queue *)local_78.data != (uv__queue *)0x0) goto LAB_001c693c;
    iVar1 = uv_tcp_connect(&local_78,&tcp_handle,(sockaddr *)(local_98 + 0x10),connect_cb);
    if (iVar1 == -0x65) {
LAB_001c6922:
      run_test_tcp_close_while_connecting_cold_13();
      return 7;
    }
    local_98._0_8_ = SEXT48(iVar1);
    local_98._8_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)local_98._0_8_ != (uv_loop_t *)0x0) goto LAB_001c6949;
    iVar1 = uv_timer_init(loop,&timer1_handle);
    local_98._0_8_ = SEXT48(iVar1);
    local_98._8_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)local_98._0_8_ != (uv_loop_t *)0x0) goto LAB_001c6956;
    iVar1 = uv_timer_start(&timer1_handle,timer1_cb,1,0);
    local_98._0_8_ = SEXT48(iVar1);
    local_98._8_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)local_98._0_8_ != (uv_loop_t *)0x0) goto LAB_001c6963;
    iVar1 = uv_timer_init(loop,&timer2_handle);
    local_98._0_8_ = SEXT48(iVar1);
    local_98._8_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)local_98._0_8_ != (uv_loop_t *)0x0) goto LAB_001c6970;
    iVar1 = uv_timer_start(&timer2_handle,timer2_cb,86400000,0);
    local_98._0_8_ = SEXT48(iVar1);
    local_98._8_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)local_98._0_8_ != (uv_loop_t *)0x0) goto LAB_001c697d;
    iVar1 = uv_run(loop,UV_RUN_DEFAULT);
    local_98._0_8_ = SEXT48(iVar1);
    local_98._8_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)local_98._0_8_ != (uv_loop_t *)0x0) goto LAB_001c698a;
    local_98._0_8_ = (uv_loop_t *)0x1;
    local_98._8_8_ = SEXT48(connect_cb_called);
    if ((uv_loop_t *)local_98._8_8_ != (uv_loop_t *)0x1) goto LAB_001c6997;
    local_98._0_8_ = (uv_loop_t *)0x1;
    local_98._8_8_ = SEXT48(timer1_cb_called);
    if ((uv_loop_t *)local_98._8_8_ != (uv_loop_t *)0x1) goto LAB_001c69a4;
    local_98._0_8_ = (uv_loop_t *)0x2;
    local_98._8_8_ = SEXT48(close_cb_called);
    if ((uv_loop_t *)local_98._8_8_ == (uv_loop_t *)0x2) {
      uv_walk(loop,close_walk_cb,(void *)0x0);
      uv_run(loop,UV_RUN_DEFAULT);
      local_98._0_8_ = (uv_loop_t *)0x0;
      iVar1 = uv_loop_close(loop);
      local_98._8_8_ = SEXT48(iVar1);
      if (local_98._0_8_ == local_98._8_8_) {
        uv_library_shutdown();
        if (netunreach_errors < 1) {
          return 0;
        }
        goto LAB_001c6922;
      }
      goto LAB_001c69be;
    }
  }
  else {
    run_test_tcp_close_while_connecting_cold_1();
LAB_001c693c:
    run_test_tcp_close_while_connecting_cold_2();
LAB_001c6949:
    run_test_tcp_close_while_connecting_cold_3();
LAB_001c6956:
    run_test_tcp_close_while_connecting_cold_4();
LAB_001c6963:
    run_test_tcp_close_while_connecting_cold_5();
LAB_001c6970:
    run_test_tcp_close_while_connecting_cold_6();
LAB_001c697d:
    run_test_tcp_close_while_connecting_cold_7();
LAB_001c698a:
    run_test_tcp_close_while_connecting_cold_8();
LAB_001c6997:
    run_test_tcp_close_while_connecting_cold_9();
LAB_001c69a4:
    run_test_tcp_close_while_connecting_cold_10();
  }
  run_test_tcp_close_while_connecting_cold_11();
LAB_001c69be:
  handle = (uv_handle_t *)local_98;
  iVar1 = (int)local_98 + 8;
  run_test_tcp_close_while_connecting_cold_12();
  if ((iVar1 != -0x7d) && (iVar1 != -0x65)) {
    connect_cb_cold_1();
    uv_close(handle,close_cb);
    uv_close((uv_handle_t *)&tcp_handle,close_cb);
    timer1_cb_called = timer1_cb_called + 1;
    return extraout_EAX;
  }
  iVar2 = uv_timer_stop(&timer2_handle);
  connect_cb_called = connect_cb_called + 1;
  if (iVar1 == -0x65) {
    netunreach_errors = netunreach_errors + 1;
  }
  return iVar2;
}

Assistant:

TEST_IMPL(tcp_close_while_connecting) {
  uv_connect_t connect_req;
  struct sockaddr_in addr;
  uv_loop_t* loop;
  int r;

  loop = uv_default_loop();
  ASSERT_OK(uv_ip4_addr("1.2.3.4", TEST_PORT, &addr));
  ASSERT_OK(uv_tcp_init(loop, &tcp_handle));
  r = uv_tcp_connect(&connect_req,
                     &tcp_handle,
                     (const struct sockaddr*) &addr,
                     connect_cb);
  if (r == UV_ENETUNREACH)
    RETURN_SKIP("Network unreachable.");
  ASSERT_OK(r);
  ASSERT_OK(uv_timer_init(loop, &timer1_handle));
  ASSERT_OK(uv_timer_start(&timer1_handle, timer1_cb, 1, 0));
  ASSERT_OK(uv_timer_init(loop, &timer2_handle));
  ASSERT_OK(uv_timer_start(&timer2_handle, timer2_cb, 86400 * 1000, 0));
  ASSERT_OK(uv_run(loop, UV_RUN_DEFAULT));

  ASSERT_EQ(1, connect_cb_called);
  ASSERT_EQ(1, timer1_cb_called);
  ASSERT_EQ(2, close_cb_called);

  MAKE_VALGRIND_HAPPY(loop);

  if (netunreach_errors > 0)
    RETURN_SKIP("Network unreachable.");

  return 0;
}